

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterRenameTable(Parse *pParse,SrcList *pSrc,Token *pName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Table *pTab_00;
  sqlite3 *psVar4;
  Table *pTVar5;
  Index *pIVar6;
  sqlite3 *psVar7;
  Parse *in_RDI;
  int i;
  VTable *pVTab;
  Vdbe *v;
  char *zTabName;
  int nTabName;
  sqlite3 *db;
  char *zName;
  Table *pTab;
  char *zDb;
  int iDb;
  Parse *in_stack_ffffffffffffff88;
  undefined8 uVar8;
  Parse *pPVar9;
  sqlite3 *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  u32 in_stack_ffffffffffffff9c;
  sqlite3 *db_00;
  sqlite3 *psVar10;
  sqlite3 *db_01;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar11;
  
  psVar7 = in_RDI->db;
  uVar11 = 0xaaaaaaaa;
  db_01 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  psVar10 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  db_00 = (sqlite3 *)0x0;
  if ((psVar7->mallocFailed == '\0') &&
     (pTab_00 = sqlite3LocateTableItem
                          ((Parse *)0x0,in_stack_ffffffffffffff9c,
                           (SrcItem *)in_stack_ffffffffffffff90), pTab_00 != (Table *)0x0)) {
    iVar1 = sqlite3SchemaToIndex(in_RDI->db,pTab_00->pSchema);
    pPVar9 = (Parse *)psVar7->aDb[iVar1].zDbSName;
    psVar4 = (sqlite3 *)
             sqlite3NameFromToken(in_stack_ffffffffffffff90,(Token *)in_stack_ffffffffffffff88);
    if (psVar4 != (sqlite3 *)0x0) {
      pTVar5 = sqlite3FindTable(psVar10,(char *)db_00,
                                (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ));
      if (pTVar5 == (Table *)0x0) {
        pIVar6 = sqlite3FindIndex(db_01,(char *)psVar10,(char *)db_00);
        iVar3 = (int)((ulong)db_01 >> 0x20);
        if ((pIVar6 == (Index *)0x0) &&
           (iVar2 = sqlite3IsShadowTableOf
                              (psVar10,(Table *)db_00,
                               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                              ), iVar2 == 0)) {
          iVar2 = isAlterableTable(in_stack_ffffffffffffff88,(Table *)0x1c6056);
          if ((iVar2 == 0) &&
             (iVar2 = sqlite3CheckObjectName
                                ((Parse *)psVar10,(char *)db_00,
                                 (char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98),
                                 (char *)in_stack_ffffffffffffff90), iVar2 == 0)) {
            if (pTab_00->eTabType == '\x02') {
              sqlite3ErrorMsg(in_RDI,"view %s may not be altered",pTab_00->zName);
            }
            else {
              iVar3 = sqlite3AuthCheck((Parse *)CONCAT44(uVar11,in_stack_ffffffffffffffb8),iVar3,
                                       (char *)psVar10,(char *)db_00,
                                       (char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                        in_stack_ffffffffffffff98));
              if ((iVar3 == 0) &&
                 (iVar3 = sqlite3ViewGetColumnNames(in_stack_ffffffffffffff88,(Table *)0x1c60f3),
                 iVar3 == 0)) {
                if ((pTab_00->eTabType == '\x01') &&
                   (db_00 = (sqlite3 *)sqlite3GetVTable(psVar7,pTab_00),
                   *(_func_int_sqlite3_vtab_ptr_char_ptr **)
                    ((long)((Vdbe *)db_00->pDfltColl)->db->aLimit + 0x10) ==
                   (_func_int_sqlite3_vtab_ptr_char_ptr *)0x0)) {
                  db_00 = (sqlite3 *)0x0;
                }
                psVar7 = (sqlite3 *)sqlite3GetVdbe(in_stack_ffffffffffffff88);
                if (psVar7 != (sqlite3 *)0x0) {
                  sqlite3MayAbort(in_RDI);
                  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
                  in_stack_ffffffffffffff90 = (sqlite3 *)pTab_00->zName;
                  iVar3 = sqlite3Utf8CharLen((char *)in_stack_ffffffffffffff90,-1);
                  uVar8 = CONCAT44(uVar11,(uint)(iVar1 == 1));
                  sqlite3NestedParse(in_RDI,
                                     "UPDATE \"%w\".sqlite_master SET sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, %d) WHERE (type!=\'index\' OR tbl_name=%Q COLLATE nocase)AND   name NOT LIKE \'sqliteX_%%\' ESCAPE \'X\'"
                                     ,pPVar9,pPVar9,in_stack_ffffffffffffff90,psVar4,uVar8,
                                     in_stack_ffffffffffffff90);
                  in_stack_ffffffffffffff88 = (Parse *)CONCAT44((int)((ulong)uVar8 >> 0x20),iVar3);
                  psVar10 = in_stack_ffffffffffffff90;
                  sqlite3NestedParse(in_RDI,
                                     "UPDATE %Q.sqlite_master SET tbl_name = %Q, name = CASE WHEN type=\'table\' THEN %Q WHEN name LIKE \'sqliteX_autoindex%%\' ESCAPE \'X\'      AND type=\'index\' THEN \'sqlite_autoindex_\' || %Q || substr(name,%d+18) ELSE name END WHERE tbl_name=%Q COLLATE nocase AND (type=\'table\' OR type=\'index\' OR type=\'trigger\');"
                                     ,pPVar9,psVar4,psVar4,psVar4);
                  pTVar5 = sqlite3FindTable(psVar7,(char *)db_00,
                                            (char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                             in_stack_ffffffffffffff98));
                  if (pTVar5 != (Table *)0x0) {
                    sqlite3NestedParse(in_RDI,
                                       "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q"
                                       ,pPVar9,psVar4,pTab_00->zName);
                  }
                  if (iVar1 != 1) {
                    sqlite3NestedParse(in_RDI,
                                       "UPDATE sqlite_temp_schema SET sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, 1), tbl_name = CASE WHEN tbl_name=%Q COLLATE nocase AND   sqlite_rename_test(%Q, sql, type, name, 1, \'after rename\', 0) THEN %Q ELSE tbl_name END WHERE type IN (\'view\', \'trigger\')"
                                       ,pPVar9,psVar10,psVar4,psVar10);
                    in_stack_ffffffffffffff88 = pPVar9;
                    in_stack_ffffffffffffff90 = psVar4;
                  }
                  if (db_00 != (sqlite3 *)0x0) {
                    in_stack_ffffffffffffff9c = in_RDI->nMem + 1;
                    in_RDI->nMem = in_stack_ffffffffffffff9c;
                    sqlite3VdbeLoadString
                              ((Vdbe *)db_00,in_stack_ffffffffffffff9c,
                               (char *)in_stack_ffffffffffffff90);
                    in_stack_ffffffffffffff88 =
                         (Parse *)CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                           0xfffffff5);
                    sqlite3VdbeAddOp4((Vdbe *)db_00,in_stack_ffffffffffffff9c,
                                      in_stack_ffffffffffffff98,
                                      (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                      (int)in_stack_ffffffffffffff90,
                                      (char *)in_stack_ffffffffffffff88,(int)psVar10);
                  }
                  renameReloadSchema((Parse *)in_stack_ffffffffffffff90,
                                     (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                     (u16)((ulong)in_stack_ffffffffffffff88 >> 0x10));
                  renameTestSchema((Parse *)psVar10,(char *)psVar7,(int)((ulong)db_00 >> 0x20),
                                   (char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                    in_stack_ffffffffffffff98),
                                   (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
                }
              }
            }
          }
          goto LAB_001c6310;
        }
      }
      sqlite3ErrorMsg(in_RDI,"there is already another table or index with this name: %s",psVar4);
    }
  }
LAB_001c6310:
  sqlite3SrcListDelete
            (db_00,(SrcList *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  sqlite3DbFree(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterRenameTable(
  Parse *pParse,            /* Parser context. */
  SrcList *pSrc,            /* The table to rename. */
  Token *pName              /* The new table name. */
){
  int iDb;                  /* Database that contains the table */
  char *zDb;                /* Name of database iDb */
  Table *pTab;              /* Table being renamed */
  char *zName = 0;          /* NULL-terminated version of pName */
  sqlite3 *db = pParse->db; /* Database connection */
  int nTabName;             /* Number of UTF-8 characters in zTabName */
  const char *zTabName;     /* Original name of the table */
  Vdbe *v;
  VTable *pVTab = 0;        /* Non-zero if this is a v-tab with an xRename() */

  if( NEVER(db->mallocFailed) ) goto exit_rename_table;
  assert( pSrc->nSrc==1 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );

  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_rename_table;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  zDb = db->aDb[iDb].zDbSName;

  /* Get a NULL terminated version of the new table name. */
  zName = sqlite3NameFromToken(db, pName);
  if( !zName ) goto exit_rename_table;

  /* Check that a table or index named 'zName' does not already exist
  ** in database iDb. If so, this is an error.
  */
  if( sqlite3FindTable(db, zName, zDb)
   || sqlite3FindIndex(db, zName, zDb)
   || sqlite3IsShadowTableOf(db, pTab, zName)
  ){
    sqlite3ErrorMsg(pParse,
        "there is already another table or index with this name: %s", zName);
    goto exit_rename_table;
  }

  /* Make sure it is not a system table being altered, or a reserved name
  ** that the table is being renamed to.
  */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ){
    goto exit_rename_table;
  }
  if( SQLITE_OK!=sqlite3CheckObjectName(pParse,zName,"table",zName) ){
    goto exit_rename_table;
  }

#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "view %s may not be altered", pTab->zName);
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_rename_table;
  }
  if( IsVirtual(pTab) ){
    pVTab = sqlite3GetVTable(db, pTab);
    if( pVTab->pVtab->pModule->xRename==0 ){
      pVTab = 0;
    }
  }
#endif

  /* Begin a transaction for database iDb. Then modify the schema cookie
  ** (since the ALTER TABLE modifies the schema). Call sqlite3MayAbort(),
  ** as the scalar functions (e.g. sqlite_rename_table()) invoked by the
  ** nested SQL may raise an exception.  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto exit_rename_table;
  }
  sqlite3MayAbort(pParse);

  /* figure out how many UTF-8 characters are in zName */
  zTabName = pTab->zName;
  nTabName = sqlite3Utf8CharLen(zTabName, -1);

  /* Rewrite all CREATE TABLE, INDEX, TRIGGER or VIEW statements in
  ** the schema to use the new table name.  */
  sqlite3NestedParse(pParse,
      "UPDATE \"%w\"." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, %d) "
      "WHERE (type!='index' OR tbl_name=%Q COLLATE nocase)"
      "AND   name NOT LIKE 'sqliteX_%%' ESCAPE 'X'"
      , zDb, zDb, zTabName, zName, (iDb==1), zTabName
  );

  /* Update the tbl_name and name columns of the sqlite_schema table
  ** as required.  */
  sqlite3NestedParse(pParse,
      "UPDATE %Q." LEGACY_SCHEMA_TABLE " SET "
          "tbl_name = %Q, "
          "name = CASE "
            "WHEN type='table' THEN %Q "
            "WHEN name LIKE 'sqliteX_autoindex%%' ESCAPE 'X' "
            "     AND type='index' THEN "
             "'sqlite_autoindex_' || %Q || substr(name,%d+18) "
            "ELSE name END "
      "WHERE tbl_name=%Q COLLATE nocase AND "
          "(type='table' OR type='index' OR type='trigger');",
      zDb,
      zName, zName, zName,
      nTabName, zTabName
  );

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* If the sqlite_sequence table exists in this database, then update
  ** it with the new table name.
  */
  if( sqlite3FindTable(db, "sqlite_sequence", zDb) ){
    sqlite3NestedParse(pParse,
        "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q",
        zDb, zName, pTab->zName);
  }
#endif

  /* If the table being renamed is not itself part of the temp database,
  ** edit view and trigger definitions within the temp database
  ** as required.  */
  if( iDb!=1 ){
    sqlite3NestedParse(pParse,
        "UPDATE sqlite_temp_schema SET "
            "sql = sqlite_rename_table(%Q, type, name, sql, %Q, %Q, 1), "
            "tbl_name = "
              "CASE WHEN tbl_name=%Q COLLATE nocase AND "
              "  sqlite_rename_test(%Q, sql, type, name, 1, 'after rename', 0) "
              "THEN %Q ELSE tbl_name END "
            "WHERE type IN ('view', 'trigger')"
        , zDb, zTabName, zName, zTabName, zDb, zName);
  }

  /* If this is a virtual table, invoke the xRename() function if
  ** one is defined. The xRename() callback will modify the names
  ** of any resources used by the v-table implementation (including other
  ** SQLite tables) that are identified by the name of the virtual table.
  */
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( pVTab ){
    int i = ++pParse->nMem;
    sqlite3VdbeLoadString(v, i, zName);
    sqlite3VdbeAddOp4(v, OP_VRename, i, 0, 0,(const char*)pVTab, P4_VTAB);
  }
#endif

  renameReloadSchema(pParse, iDb, INITFLAG_AlterRename);
  renameTestSchema(pParse, zDb, iDb==1, "after rename", 0);

exit_rename_table:
  sqlite3SrcListDelete(db, pSrc);
  sqlite3DbFree(db, zName);
}